

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O0

string * __thiscall
t_swift_generator::async_function_signature_abi_cxx11_
          (string *__return_storage_ptr__,t_swift_generator *this,t_function *tfunction)

{
  uint uVar1;
  string *psVar2;
  t_struct *ptVar3;
  members_type *pmVar4;
  size_type sVar5;
  char *pcVar6;
  allocator local_309;
  string local_308;
  string local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  byte local_202;
  allocator local_201;
  string local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  undefined1 local_1c0 [8];
  string response_param;
  string local_198;
  string local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  byte local_b2;
  allocator local_b1;
  string local_b0;
  allocator local_89;
  undefined1 local_88 [8];
  string response_string;
  string local_58;
  undefined1 local_31;
  t_struct *local_30;
  t_struct *targlist;
  t_type *ttype;
  t_function *tfunction_local;
  t_swift_generator *this_local;
  string *result;
  
  ttype = (t_type *)tfunction;
  tfunction_local = (t_function *)this;
  this_local = (t_swift_generator *)__return_storage_ptr__;
  targlist = (t_struct *)t_function::get_returntype(tfunction);
  local_30 = t_function::get_arglist((t_function *)ttype);
  local_31 = 0;
  if ((this->gen_cocoa_ & 1U) == 0) {
    psVar2 = t_function::get_name_abi_cxx11_((t_function *)ttype);
    std::__cxx11::string::string((string *)&local_58,(string *)psVar2);
  }
  else {
    function_name_abi_cxx11_(&local_58,this,(t_function *)ttype);
  }
  std::operator+(__return_storage_ptr__,"func ",&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  if ((this->gen_cocoa_ & 1U) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_88,"(Result<",&local_89);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
    local_b2 = 0;
    uVar1 = (*(targlist->super_t_type).super_t_doc._vptr_t_doc[4])();
    if ((uVar1 & 1) == 0) {
      type_name_abi_cxx11_(&local_b0,this,&targlist->super_t_type,false,false);
    }
    else {
      std::allocator<char>::allocator();
      local_b2 = 1;
      std::__cxx11::string::string((string *)&local_b0,"Void",&local_b1);
    }
    std::__cxx11::string::operator+=((string *)local_88,(string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    if ((local_b2 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_b1);
    }
    std::__cxx11::string::operator+=((string *)local_88,", Error>) -> Void");
    ptVar3 = t_function::get_arglist((t_function *)ttype);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_198,"",(allocator *)(response_param.field_2._M_local_buf + 0xf));
    argument_list(&local_178,this,ptVar3,&local_198,false);
    std::operator+(&local_158,"(",&local_178);
    pmVar4 = t_struct::get_members(local_30);
    sVar5 = std::vector<t_field_*,_std::allocator<t_field_*>_>::size(pmVar4);
    pcVar6 = "";
    if (sVar5 != 0) {
      pcVar6 = ", ";
    }
    std::operator+(&local_138,&local_158,pcVar6);
    std::operator+(&local_118,&local_138,"completion: @escaping ");
    std::operator+(&local_f8,&local_118,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
    std::operator+(&local_d8,&local_f8,")");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_198);
    std::allocator<char>::~allocator((allocator<char> *)(response_param.field_2._M_local_buf + 0xf))
    ;
    std::__cxx11::string::~string((string *)local_88);
  }
  else {
    local_202 = 0;
    uVar1 = (*(targlist->super_t_type).super_t_doc._vptr_t_doc[4])();
    if ((uVar1 & 1) == 0) {
      type_name_abi_cxx11_(&local_200,this,&targlist->super_t_type,false,false);
    }
    else {
      std::allocator<char>::allocator();
      local_202 = 1;
      std::__cxx11::string::string((string *)&local_200,"",&local_201);
    }
    std::operator+(&local_1e0,"(",&local_200);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0,
                   &local_1e0,") -> Void");
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_200);
    if ((local_202 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_201);
    }
    ptVar3 = t_function::get_arglist((t_function *)ttype);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_308,"",&local_309);
    argument_list(&local_2e8,this,ptVar3,&local_308,false);
    std::operator+(&local_2c8,"(",&local_2e8);
    pmVar4 = t_struct::get_members(local_30);
    sVar5 = std::vector<t_field_*,_std::allocator<t_field_*>_>::size(pmVar4);
    pcVar6 = "";
    if (sVar5 != 0) {
      pcVar6 = ", ";
    }
    std::operator+(&local_2a8,&local_2c8,pcVar6);
    std::operator+(&local_288,&local_2a8,"success: ");
    std::operator+(&local_268,&local_288,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0);
    std::operator+(&local_248,&local_268,", ");
    std::operator+(&local_228,&local_248,"failure: (NSError) -> Void) throws");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_228);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)&local_2c8);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::__cxx11::string::~string((string *)&local_308);
    std::allocator<char>::~allocator((allocator<char> *)&local_309);
    std::__cxx11::string::~string((string *)local_1c0);
  }
  return __return_storage_ptr__;
}

Assistant:

string t_swift_generator::async_function_signature(t_function* tfunction) {
  t_type* ttype = tfunction->get_returntype();
  t_struct* targlist = tfunction->get_arglist();
  string result = "func " + (gen_cocoa_ ? function_name(tfunction) : tfunction->get_name());

  if (!gen_cocoa_) {
    string response_string = "(Result<";
    response_string += (ttype->is_void()) ? "Void" : type_name(ttype);
    response_string += ", Error>) -> Void";
    result += "(" + argument_list(tfunction->get_arglist(), "", false)
            + (targlist->get_members().size() ? ", " : "")
            + "completion: @escaping " + response_string + ")";
  } else {
    string response_param = "(" + ((ttype->is_void()) ? "" : type_name(ttype)) + ") -> Void";
    result += "(" + argument_list(tfunction->get_arglist(), "", false)
            + (targlist->get_members().size() ? ", " : "")
            + "success: " + response_param + ", "
            + "failure: (NSError) -> Void) throws";
  }
  return result;
}